

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test::
SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test
          (SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test *this)

{
  SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test_003db130;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_retrieving_after_no_change_returns_null)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    EXPECT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.NextSubscriptionSync();
    EXPECT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Register(SS_SUBJECT0, false);
    EXPECT_FALSE(subject_register.NextSubscriptionSync());
}